

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void __thiscall
DGlow2::DGlow2(DGlow2 *this,sector_t *sector,int start,int end,int tics,bool oneshot)

{
  int iVar1;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  if (0x7ffe < start) {
    start = 0x7fff;
  }
  if (start < -0x7fff) {
    start = -0x8000;
  }
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f9378;
  iVar1 = 0x7fff;
  if (end < 0x7fff) {
    iVar1 = end;
  }
  this->m_Start = start;
  if (iVar1 < -0x7fff) {
    iVar1 = -0x8000;
  }
  this->m_End = iVar1;
  this->m_MaxTics = tics;
  this->m_Tics = -1;
  this->m_OneShot = oneshot;
  return;
}

Assistant:

DGlow2::DGlow2 (sector_t *sector, int start, int end, int tics, bool oneshot)
	: DLighting (sector)
{
	m_Start = sector_t::ClampLight(start);
	m_End = sector_t::ClampLight(end);
	m_MaxTics = tics;
	m_Tics = -1;
	m_OneShot = oneshot;
}